

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall CTPNBin::gen_binary(CTPNBin *this,uchar opc,int discard,int for_condition)

{
  CTcPrsNode *pCVar1;
  
  pCVar1 = (this->super_CTPNBinBase).left_;
  (**(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)
            (pCVar1,(ulong)(uint)discard,(ulong)(uint)for_condition);
  pCVar1 = (this->super_CTPNBinBase).right_;
  (**(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)
            (pCVar1,(ulong)(uint)discard,(ulong)(uint)for_condition);
  if (discard == 0) {
    CTcGenTarg::write_op(G_cg,opc);
    G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  }
  return;
}

Assistant:

void CTPNBin::gen_binary(uchar opc, int discard, int for_condition)
{
    /* 
     *   generate the operands, passing through the discard and
     *   conditional status 
     */
    left_->gen_code(discard, for_condition);
    right_->gen_code(discard, for_condition);

    /* generate our operand if we're not discarding the result */
    if (!discard)
    {
        /* apply the operator */
        G_cg->write_op(opc);

        /* 
         *   binary operators all remove two values and push one, so there's
         *   a net pop 
         */
        G_cg->note_pop();
    }
}